

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

void __thiscall
SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount>::
Iterate<InterpreterThunkEmitter::Close()::__0>
          (SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  undefined1 local_40 [8];
  Iterator iter;
  
  local_40 = (undefined1  [8])this;
  iter.list = (SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)this;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while( true ) {
    if (iter.list == (SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    iter.list = (SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)
                ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])iter.list == local_40) break;
    pTVar4 = SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)local_40);
    PDataManager::UnregisterPdata((RUNTIME_FUNCTION *)pTVar4->registeredPdataTable);
  }
  return;
}

Assistant:

void Iterate(Fn fn)
    {
        Iterator iter(this);
        while(iter.Next())
        {
            fn(iter.Data());
        }
    }